

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O0

size_t __thiscall
robin_hood::detail::
Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
::erase(Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
        *this,key_type *key)

{
  size_t __x;
  bool bVar1;
  type __y;
  InfoType local_2c;
  size_t sStack_28;
  InfoType info;
  size_t idx;
  key_type *key_local;
  Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
  *this_local;
  
  sStack_28 = 0;
  local_2c = 0;
  idx = (size_t)key;
  key_local = (key_type *)this;
  Table<true,80ul,Rml::PropertyId,Rml::Property,robin_hood::hash<Rml::PropertyId,void>,std::equal_to<Rml::PropertyId>>
  ::keyToIdx<Rml::PropertyId_const&>
            ((Table<true,80ul,Rml::PropertyId,Rml::Property,robin_hood::hash<Rml::PropertyId,void>,std::equal_to<Rml::PropertyId>>
              *)this,key,&stack0xffffffffffffffd8,&local_2c);
  do {
    __x = idx;
    if (local_2c == this->mInfo[sStack_28]) {
      __y = Table<true,80ul,Rml::PropertyId,Rml::Property,robin_hood::hash<Rml::PropertyId,void>,std::equal_to<Rml::PropertyId>>
            ::
            DataNode<robin_hood::detail::Table<true,80ul,Rml::PropertyId,Rml::Property,robin_hood::hash<Rml::PropertyId,void>,std::equal_to<Rml::PropertyId>>,true>
            ::getFirst<robin_hood::pair<Rml::PropertyId,Rml::Property>>
                      ((DataNode<robin_hood::detail::Table<true,80ul,Rml::PropertyId,Rml::Property,robin_hood::hash<Rml::PropertyId,void>,std::equal_to<Rml::PropertyId>>,true>
                        *)(this->mKeyVals + sStack_28));
      bVar1 = std::equal_to<Rml::PropertyId>::operator()
                        ((equal_to<Rml::PropertyId> *)this,(PropertyId *)__x,__y);
      if (bVar1) {
        shiftDown(this,sStack_28);
        this->mNumElements = this->mNumElements - 1;
        return 1;
      }
    }
    next(this,&local_2c,&stack0xffffffffffffffd8);
  } while (local_2c <= this->mInfo[sStack_28]);
  return 0;
}

Assistant:

size_t erase(const key_type& key) {
        ROBIN_HOOD_TRACE(this)
        size_t idx{};
        InfoType info{};
        keyToIdx(key, &idx, &info);

        // check while info matches with the source idx
        do {
            if (info == mInfo[idx] && WKeyEqual::operator()(key, mKeyVals[idx].getFirst())) {
                shiftDown(idx);
                --mNumElements;
                return 1;
            }
            next(&info, &idx);
        } while (info <= mInfo[idx]);

        // nothing found to delete
        return 0;
    }